

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O2

void __thiscall Polynom<Finite>::extend(Polynom<Finite> *this,uint sz)

{
  uint *puVar1;
  uint width;
  Matrix<Finite> local_30;
  Matrix<Finite> local_20;
  
  puVar1 = &(this->m).N;
  width = sz - *puVar1;
  if (*puVar1 <= sz && width != 0) {
    Matrix<Finite>::Matrix(&local_20,1,width);
    Matrix<Finite>::joinHorizontal(&local_30,&local_20);
    Matrix<Finite>::operator=(&this->m,&local_30);
    Matrix<Finite>::~Matrix(&local_30);
    Matrix<Finite>::~Matrix(&local_20);
  }
  return;
}

Assistant:

void Polynom<Field>::extend(unsigned sz)
{
    if(sz > m.width())
        m = Matrix<Field>(1, sz - m.width()).joinHorizontal(m);
}